

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

ssize_t __thiscall DistanceGraph::write(DistanceGraph *this,int __fd,void *__buf,size_t __n)

{
  pointer pvVar1;
  undefined4 in_register_00000034;
  char *pcVar2;
  vector<Link,_std::allocator<Link>_> *v;
  pointer pvVar3;
  uint64_t s;
  uint64_t count;
  long local_40;
  size_type local_38;
  long local_30;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  local_38 = (this->name)._M_string_length;
  std::ostream::write(pcVar2,(long)&local_38);
  std::ostream::write(pcVar2,(long)(this->name)._M_dataplus._M_p);
  local_30 = ((long)(this->links).
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->links).
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_40 = std::ostream::write(pcVar2,(long)&local_30);
  if (local_30 != 0) {
    pvVar3 = (this->links).
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (this->links).
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar3 != pvVar1) {
      do {
        local_40 = ((long)(pvVar3->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pvVar3->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        std::ostream::write(pcVar2,(long)&local_40);
        if (local_40 != 0) {
          local_40 = std::ostream::write(pcVar2,(long)(pvVar3->
                                                  super__Vector_base<Link,_std::allocator<Link>_>).
                                                  _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar3 = pvVar3 + 1;
      } while (pvVar3 != pvVar1);
    }
  }
  return local_40;
}

Assistant:

void DistanceGraph::write(std::ofstream &output_file) {
    uint64_t s=name.size();
    output_file.write((char *) &s,sizeof(s));
    output_file.write((char *)name.data(),name.size());
    sdglib::write_flat_vectorvector(output_file, links);
}